

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.h
# Opt level: O1

void __thiscall
chrono::robosimian::LinkData::LinkData(LinkData *this,string *myname,Link *mylink,bool inc)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (myname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + myname->_M_string_length)
  ;
  (this->link).m_mesh_name._M_dataplus._M_p = (pointer)&(this->link).m_mesh_name.field_2;
  pcVar1 = (mylink->m_mesh_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->link,pcVar1,pcVar1 + (mylink->m_mesh_name)._M_string_length);
  (this->link).m_offset.m_data[0] = (mylink->m_offset).m_data[0];
  (this->link).m_offset.m_data[1] = (mylink->m_offset).m_data[1];
  (this->link).m_offset.m_data[2] = (mylink->m_offset).m_data[2];
  (this->link).m_color.R = (mylink->m_color).R;
  (this->link).m_color.G = (mylink->m_color).G;
  (this->link).m_color.B = (mylink->m_color).B;
  (this->link).m_mass = mylink->m_mass;
  (this->link).m_com.m_data[0] = (mylink->m_com).m_data[0];
  (this->link).m_com.m_data[1] = (mylink->m_com).m_data[1];
  (this->link).m_com.m_data[2] = (mylink->m_com).m_data[2];
  (this->link).m_inertia_xx.m_data[0] = (mylink->m_inertia_xx).m_data[0];
  (this->link).m_inertia_xx.m_data[1] = (mylink->m_inertia_xx).m_data[1];
  (this->link).m_inertia_xx.m_data[2] = (mylink->m_inertia_xx).m_data[2];
  (this->link).m_inertia_xy.m_data[0] = (mylink->m_inertia_xy).m_data[0];
  (this->link).m_inertia_xy.m_data[1] = (mylink->m_inertia_xy).m_data[1];
  (this->link).m_inertia_xy.m_data[2] = (mylink->m_inertia_xy).m_data[2];
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::vector(&(this->link).m_shapes,&mylink->m_shapes);
  this->include = inc;
  return;
}

Assistant:

struct CH_MODELS_API LinkData {
    LinkData(std::string myname, Link mylink, bool inc) : name(myname), link(mylink), include(inc) {}
    ////LinkData(LinkData&&) {}

    std::string name;
    Link link;
    bool include;
}